

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O3

string * __thiscall
FIX::CheckSumConvertor::convert_abi_cxx11_
          (string *__return_storage_ptr__,CheckSumConvertor *this,int value)

{
  undefined1 *puVar1;
  FieldConvertError *this_00;
  long lVar2;
  undefined4 in_register_00000014;
  size_t __n;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  char result [3];
  byte abStack_45 [5];
  string local_40;
  
  uVar3 = (uint)this;
  if (0xff < uVar3) {
    this_00 = (FieldConvertError *)
              __cxa_allocate_exception(0x50,this,CONCAT44(in_register_00000014,value));
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
    FieldConvertError::FieldConvertError(this_00,&local_40);
    __cxa_throw(this_00,&FieldConvertError::typeinfo,Exception::~Exception);
  }
  puVar1 = (undefined1 *)((long)&local_40._M_dataplus._M_p + 3);
  if (99 < uVar3) {
    do {
      uVar4 = (uint)this;
      uVar3 = (uint)(((ulong)this & 0xffffffff) / 100);
      this = (CheckSumConvertor *)(((ulong)this & 0xffffffff) / 100);
      *(undefined2 *)(puVar1 + -2) =
           *(undefined2 *)(digit_pairs + (ulong)(uVar4 + (int)this * -100) * 2);
      puVar1 = puVar1 + -2;
    } while (9999 < uVar4);
  }
  if (uVar3 < 10) {
    bVar5 = (byte)uVar3 | 0x30;
    lVar2 = -1;
  }
  else {
    *(undefined1 *)&((_Alloc_hider *)(puVar1 + -1))->_M_p =
         digit_pairs[((ulong)uVar3 * 2 & 0xffffffff) + 1];
    bVar5 = digit_pairs[(ulong)uVar3 * 2];
    lVar2 = -2;
  }
  puVar1[lVar2] = bVar5;
  __n = (long)(puVar1 + lVar2) - (long)&local_40;
  if (&local_40 <= (string *)(puVar1 + lVar2) && __n != 0) {
    memset(&local_40,0x30,__n);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  *(undefined2 *)&__return_storage_ptr__->field_2 = local_40._M_dataplus._M_p._0_2_;
  (__return_storage_ptr__->field_2)._M_local_buf[2] = local_40._M_dataplus._M_p._2_1_;
  __return_storage_ptr__->_M_string_length = 3;
  (__return_storage_ptr__->field_2)._M_local_buf[3] = '\0';
  return __return_storage_ptr__;
}

Assistant:

EXCEPT(FieldConvertError) {
    if (value > 255 || value < 0) {
      throw FieldConvertError();
    }
    char result[3];
    integer_to_string_padded(result, sizeof(result), value);
    return std::string(result, sizeof(result));
  }